

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  pointer *this;
  initializer_list<Node> __l;
  Node node;
  allocator_type local_e1;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined4 local_c0;
  vector<Node,_std::allocator<Node>_> local_b8;
  Node local_a0;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined4 local_40;
  pointer local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"apple","");
  local_c0 = 3;
  local_a0.key._M_dataplus._M_p = (pointer)&local_a0.key.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"banana","");
  local_a0.value = 7;
  local_60[0] = local_50;
  local_a0.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a0.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a0.children.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"cherry","");
  local_40 = 0xb;
  local_38 = (pointer)0x0;
  uStack_30 = 0;
  local_28 = 0;
  __l._M_len = 2;
  __l._M_array = &local_a0;
  std::vector<Node,_std::allocator<Node>_>::vector(&local_b8,__l,&local_e1);
  lVar1 = -0x80;
  this = &local_38;
  do {
    std::vector<Node,_std::allocator<Node>_>::~vector((vector<Node,_std::allocator<Node>_> *)this);
    if ((pointer)(this + -3) != this[-5]) {
      operator_delete(this[-5]);
    }
    this = this + -8;
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0);
  (*Node::Reflection.super_TypeDescriptor._vptr_TypeDescriptor[3])(&Node::Reflection,local_e0,0);
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_b8);
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0]);
  }
  return 0;
}

Assistant:

int main() {
    // Create an object of type Node
    Node node = {"apple", 3, {{"banana", 7, {}}, {"cherry", 11, {}}}};

    // Find Node's type descriptor
    reflect::TypeDescriptor* typeDesc = reflect::TypeResolver<Node>::get();

    // Dump a description of the Node object to the console
    typeDesc->dump(&node);

    return 0;
}